

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O2

void __thiscall SQOuter::Finalize(SQOuter *this)

{
  SQObjectPtr::Null(&this->_value);
  return;
}

Assistant:

void Finalize() { _value.Null(); }